

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O3

JavascriptArrayBuffer * __thiscall
Js::AsmJsScriptFunction::GetAsmJsArrayBuffer(AsmJsScriptFunction *this)

{
  return (JavascriptArrayBuffer *)((this->m_moduleEnvironment).ptr)->ptr;
}

Assistant:

JavascriptArrayBuffer* AsmJsScriptFunction::GetAsmJsArrayBuffer() const
    {
#ifdef ASMJS_PLAT
        return (JavascriptArrayBuffer*)PointerValue(
            *(this->GetModuleEnvironment() + AsmJsModuleMemory::MemoryTableBeginOffset));
#else
        Assert(UNREACHED);
        return nullptr;
#endif
    }